

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

bool __thiscall wabt::WastParser::ParseElemExprOpt(WastParser *this,ElemExpr *out_elem_expr)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Result RVar4;
  Var local_1e0;
  ElemExpr local_198;
  uint local_140;
  Enum local_13c;
  Location local_138;
  undefined1 local_118 [8];
  Var var;
  ElemExpr local_c8;
  Enum local_70;
  Type local_6c;
  char *pcStack_68;
  Type type;
  undefined1 auStack_40 [6];
  bool lpar;
  bool item;
  Location loc;
  ElemExpr *out_elem_expr_local;
  WastParser *this_local;
  
  loc.field_1._8_8_ = out_elem_expr;
  GetLocation((Location *)auStack_40,this);
  bVar1 = MatchLpar(this,Item);
  bVar2 = Match(this,Lpar);
  bVar3 = Match(this,RefNull);
  if (bVar3) {
    bVar3 = Features::bulk_memory_enabled((Features *)this->options_);
    if ((!bVar3) && (bVar3 = Features::reference_types_enabled((Features *)this->options_), !bVar3))
    {
      pcStack_68 = _auStack_40;
      Error(this,0x2e7321);
    }
    local_70 = (Enum)ParseRefKind(this,&local_6c);
    bVar3 = Failed((Result)local_70);
    if (bVar3) {
      this_local._7_1_ = 1;
      goto LAB_0024324d;
    }
    var.field_2._28_4_ = local_6c.enum_;
    ElemExpr::ElemExpr(&local_c8,local_6c);
    ElemExpr::operator=((ElemExpr *)loc.field_1._8_8_,&local_c8);
    ElemExpr::~ElemExpr(&local_c8);
  }
  else {
    bVar3 = Match(this,RefFunc);
    if (!bVar3) {
      this_local._7_1_ = 0;
      goto LAB_0024324d;
    }
    Location::Location(&local_138);
    Var::Var((Var *)local_118,0xffffffff,&local_138);
    local_13c = (Enum)ParseVar(this,(Var *)local_118);
    bVar3 = Failed((Result)local_13c);
    if (bVar3) {
      this_local._7_1_ = 1;
    }
    else {
      Var::Var(&local_1e0,(Var *)local_118);
      ElemExpr::ElemExpr(&local_198,&local_1e0);
      ElemExpr::operator=((ElemExpr *)loc.field_1._8_8_,&local_198);
      ElemExpr::~ElemExpr(&local_198);
      Var::~Var(&local_1e0);
    }
    local_140 = (uint)bVar3;
    Var::~Var((Var *)local_118);
    if (local_140 != 0) goto LAB_0024324d;
  }
  if (bVar2) {
    RVar4 = Expect(this,Rpar);
    bVar2 = Failed(RVar4);
    if (bVar2) {
      this_local._7_1_ = 1;
      goto LAB_0024324d;
    }
  }
  if (bVar1) {
    RVar4 = Expect(this,Rpar);
    bVar1 = Failed(RVar4);
    if (bVar1) {
      this_local._7_1_ = 1;
      goto LAB_0024324d;
    }
  }
  this_local._7_1_ = 1;
LAB_0024324d:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool WastParser::ParseElemExprOpt(ElemExpr* out_elem_expr) {
  Location loc = GetLocation();
  bool item = MatchLpar(TokenType::Item);
  bool lpar = Match(TokenType::Lpar);
  if (Match(TokenType::RefNull)) {
    if (!(options_->features.bulk_memory_enabled() ||
          options_->features.reference_types_enabled())) {
      Error(loc, "ref.null not allowed");
    }
    Type type;
    CHECK_RESULT(ParseRefKind(&type));
    *out_elem_expr = ElemExpr(type);
  } else if (Match(TokenType::RefFunc)) {
    Var var;
    CHECK_RESULT(ParseVar(&var));
    *out_elem_expr = ElemExpr(var);
  } else {
    return false;
  }
  if (lpar) {
    EXPECT(Rpar);
  }
  if (item) {
    EXPECT(Rpar);
  }
  return true;
}